

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswCnf.c
# Opt level: O2

Ssw_Sat_t * Ssw_SatStart(int fPolarFlip)

{
  Ssw_Sat_t *pSVar1;
  Vec_Int_t *p;
  int *piVar2;
  Vec_Ptr_t *pVVar3;
  sat_solver *s;
  int nCap;
  int local_2c;
  
  nCap = 1;
  pSVar1 = (Ssw_Sat_t *)calloc(1,0x40);
  pSVar1->fPolarFlip = fPolarFlip;
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 10000;
  piVar2 = (int *)calloc(1,40000);
  p->pArray = piVar2;
  p->nSize = 10000;
  pSVar1->vSatVars = p;
  pVVar3 = Vec_PtrAlloc(nCap);
  pSVar1->vFanins = pVVar3;
  pVVar3 = Vec_PtrAlloc(nCap);
  pSVar1->vUsedPis = pVVar3;
  s = sat_solver_new();
  pSVar1->pSat = s;
  sat_solver_setnvars(s,1000);
  local_2c = 3 - (uint)(fPolarFlip == 0);
  sat_solver_addclause(s,&local_2c,(lit *)&stack0xffffffffffffffd8);
  pSVar1->nSatVars = 2;
  Vec_IntWriteEntry(p,0,1);
  return pSVar1;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Starts the SAT manager.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Ssw_Sat_t * Ssw_SatStart( int fPolarFlip )
{
    Ssw_Sat_t * p;
    int Lit;
    p = ABC_ALLOC( Ssw_Sat_t, 1 );
    memset( p, 0, sizeof(Ssw_Sat_t) );
    p->pAig          = NULL;
    p->fPolarFlip    = fPolarFlip;
    p->vSatVars      = Vec_IntStart( 10000 );
    p->vFanins       = Vec_PtrAlloc( 100 );
    p->vUsedPis      = Vec_PtrAlloc( 100 );
    p->pSat          = sat_solver_new();
    sat_solver_setnvars( p->pSat, 1000 );
    // var 0 is not used
    // var 1 is reserved for const1 node - add the clause
    p->nSatVars = 1;
    Lit = toLit( p->nSatVars );
    if ( fPolarFlip )
        Lit = lit_neg( Lit );
    sat_solver_addclause( p->pSat, &Lit, &Lit + 1 );
//    Ssw_ObjSetSatNum( p, Aig_ManConst1(p->pAig), p->nSatVars++ );
    Vec_IntWriteEntry( p->vSatVars, 0, p->nSatVars++ );
    return p;
}